

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

bool __thiscall BamTools::BamAlignment::BuildCharData(BamAlignment *this)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  void *__dest;
  char *in_RDI;
  string message_1;
  string message_2;
  size_t j;
  uint32_t numElements;
  char arrayType;
  char type;
  size_t i_2;
  char *tagData;
  string message;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  int k;
  size_t i_1;
  char *qualData;
  char singleBase;
  size_t i;
  char *seqData;
  bool hasTagData;
  bool hasQualData;
  bool hasSeqData;
  uint tagDataLength;
  uint tagDataOffset;
  uint qualDataOffset;
  uint seqDataOffset;
  uint dataLength;
  bool IsBigEndian;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_stack_fffffffffffffd78;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  allocator local_221;
  string *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  BamAlignment *in_stack_fffffffffffffdf0;
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  string local_168 [32];
  ulong local_148;
  uint local_140;
  char local_13a;
  undefined1 local_139;
  ulong local_138;
  void *local_130;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [48];
  string local_a8 [32];
  reference local_88;
  CigarOp *local_80;
  CigarOp *local_70;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_68;
  int local_5c;
  ulong local_58;
  char *local_50;
  char local_41;
  ulong local_40;
  long local_38;
  byte local_2b;
  byte local_2a;
  byte local_29;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  byte local_11;
  byte local_1;
  
  if ((in_RDI[0x130] & 1U) == 0) {
    local_1 = 1;
  }
  else {
    local_11 = SystemIsBigEndian();
    local_18 = *(int *)(in_RDI + 0x120) - 0x20;
    local_1c = *(int *)(in_RDI + 0x128) + *(int *)(in_RDI + 0x124) * 4;
    local_20 = local_1c + (*(int *)(in_RDI + 300) + 1U >> 1);
    local_24 = local_20 + *(int *)(in_RDI + 300);
    local_28 = local_18 - local_24;
    local_29 = local_1c < local_20;
    local_2a = local_20 < local_24;
    local_2b = local_24 < local_18;
    std::__cxx11::string::data();
    std::__cxx11::string::assign(in_RDI);
    std::__cxx11::string::clear();
    if ((local_29 & 1) != 0) {
      local_38 = std::__cxx11::string::data();
      local_38 = local_38 + (ulong)local_1c;
      std::__cxx11::string::reserve((ulong)(in_RDI + 0x28));
      for (local_40 = 0; local_40 < *(uint *)(in_RDI + 300); local_40 = local_40 + 1) {
        local_41 = "=ACMGRSVTWYHKDBN"
                   [(int)((int)*(char *)(local_38 + (local_40 >> 1)) >>
                          (('\x01' - ((byte)local_40 & 1)) * '\x04' & 0x1f) & 0xf)];
        std::__cxx11::string::append((ulong)(in_RDI + 0x28),'\x01');
      }
    }
    std::__cxx11::string::clear();
    if ((local_2a & 1) != 0) {
      lVar2 = std::__cxx11::string::data();
      local_50 = (char *)(lVar2 + (ulong)local_20);
      if (*local_50 == -1) {
        std::__cxx11::string::resize((ulong)(in_RDI + 0x68),(char)*(undefined4 *)(in_RDI + 300));
      }
      else {
        std::__cxx11::string::reserve((ulong)(in_RDI + 0x68));
        for (local_58 = 0; local_58 < *(uint *)(in_RDI + 300); local_58 = local_58 + 1) {
          std::__cxx11::string::append((ulong)(in_RDI + 0x68),'\x01');
        }
      }
    }
    std::__cxx11::string::clear();
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (bVar1 = std::operator!=(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78), bVar1)
       ) {
      std::__cxx11::string::reserve((ulong)(in_RDI + 0x48));
      local_5c = 0;
      local_70 = (CigarOp *)
                 std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                           ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                            (in_RDI + 0xb8));
      __gnu_cxx::
      __normal_iterator<BamTools::CigarOp_const*,std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>>
      ::__normal_iterator<BamTools::CigarOp*>
                ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                  *)in_stack_fffffffffffffd80,
                 (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                  *)in_stack_fffffffffffffd78);
      local_80 = (CigarOp *)
                 std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                           ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                            (in_RDI + 0xb8));
      __gnu_cxx::
      __normal_iterator<BamTools::CigarOp_const*,std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>>
      ::__normal_iterator<BamTools::CigarOp*>
                ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                  *)in_stack_fffffffffffffd80,
                 (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                  *)in_stack_fffffffffffffd78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                                 *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78), bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                   ::operator*(&local_68);
        switch(local_88->Type) {
        case '=':
        case 'I':
        case 'M':
        case 'X':
          std::__cxx11::string::substr((ulong)local_a8,(ulong)(in_RDI + 0x28));
          std::__cxx11::string::append((string *)(in_RDI + 0x48));
          std::__cxx11::string::~string(local_a8);
        case 'S':
          local_5c = local_88->Length + local_5c;
          break;
        default:
          std::allocator<char>::allocator();
          cVar5 = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38);
          std::__cxx11::string::string(local_f8,"invalid CIGAR operation type: ",&local_f9);
          std::operator+(in_stack_fffffffffffffd88,cVar5);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,"BamAlignment::BuildCharData",&local_121);
          SetErrorString(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffde0);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          local_1 = 0;
          std::__cxx11::string::~string(local_d8);
          goto LAB_002bff8d;
        case 'D':
          std::__cxx11::string::append((ulong)(in_RDI + 0x48),(char)local_88->Length);
          break;
        case 'H':
          break;
        case 'N':
          std::__cxx11::string::append((ulong)(in_RDI + 0x48),(char)local_88->Length);
          break;
        case 'P':
          std::__cxx11::string::append((ulong)(in_RDI + 0x48),(char)local_88->Length);
        }
        __gnu_cxx::
        __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
        ::operator++(&local_68);
      }
    }
    std::__cxx11::string::clear();
    if ((local_2b & 1) != 0) {
      lVar2 = std::__cxx11::string::data();
      local_130 = (void *)(lVar2 + (ulong)local_24);
      if ((local_11 & 1) != 0) {
        local_138 = 0;
        while (local_138 < local_28) {
          local_139 = *(undefined1 *)((long)local_130 + local_138 + 2);
          lVar2 = local_138 + 3;
          switch(local_139) {
          case 0x41:
          case 0x43:
          case 99:
            local_138 = local_138 + 4;
            break;
          case 0x42:
            local_13a = *(char *)((long)local_130 + lVar2);
            local_138 = local_138 + 4;
            SwapEndian_32p((char *)in_stack_fffffffffffffd80);
            local_140 = *(uint *)((long)local_130 + local_138);
            local_138 = local_138 + 4;
            for (local_148 = 0; local_148 < local_140; local_148 = local_148 + 1) {
              if (local_13a == 'C') {
LAB_002bfbaf:
                local_138 = local_138 + 1;
              }
              else if (local_13a == 'I') {
LAB_002bfbf6:
                SwapEndian_32p((char *)in_stack_fffffffffffffd80);
                local_138 = local_138 + 4;
              }
              else {
                if (local_13a != 'S') {
                  if (local_13a == 'c') goto LAB_002bfbaf;
                  if ((local_13a == 'f') || (local_13a == 'i')) goto LAB_002bfbf6;
                  if (local_13a != 's') {
                    std::allocator<char>::allocator();
                    cVar5 = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38);
                    std::__cxx11::string::string(local_188,"invalid binary array type: ",&local_189)
                    ;
                    std::operator+(in_stack_fffffffffffffd88,cVar5);
                    std::__cxx11::string::~string(local_188);
                    std::allocator<char>::~allocator((allocator<char> *)&local_189);
                    paVar4 = &local_1b1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_1b0,"BamAlignment::BuildCharData",paVar4);
                    SetErrorString(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                                   in_stack_fffffffffffffde0);
                    std::__cxx11::string::~string(local_1b0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
                    local_1 = 0;
                    std::__cxx11::string::~string(local_168);
                    goto LAB_002bff8d;
                  }
                }
                SwapEndian_16p((char *)in_stack_fffffffffffffd80);
                local_138 = local_138 + 2;
              }
            }
            break;
          default:
            paVar4 = &local_1f9;
            local_138 = lVar2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f8,"invalid tag type: ",paVar4);
            std::operator+(in_stack_fffffffffffffd88,(char)((ulong)paVar4 >> 0x38));
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
            paVar4 = &local_221;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffde0,"BamAlignment::BuildCharData",paVar4);
            SetErrorString(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                           in_stack_fffffffffffffde0);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
            std::allocator<char>::~allocator((allocator<char> *)&local_221);
            local_1 = 0;
            std::__cxx11::string::~string(local_1d8);
            goto LAB_002bff8d;
          case 0x48:
          case 0x5a:
            for (local_138 = lVar2; *(char *)((long)local_130 + local_138) != '\0';
                local_138 = local_138 + 1) {
            }
            local_138 = local_138 + 1;
            break;
          case 0x49:
          case 0x66:
          case 0x69:
            local_138 = lVar2;
            SwapEndian_32p((char *)in_stack_fffffffffffffd80);
            local_138 = local_138 + 4;
            break;
          case 0x53:
          case 0x73:
            local_138 = lVar2;
            SwapEndian_16p((char *)in_stack_fffffffffffffd80);
            local_138 = local_138 + 2;
          }
        }
      }
      std::__cxx11::string::resize((ulong)(in_RDI + 0x88));
      __dest = (void *)std::__cxx11::string::data();
      memcpy(__dest,local_130,(ulong)local_28);
    }
    in_RDI[0x130] = '\0';
    local_1 = 1;
  }
LAB_002bff8d:
  return (bool)(local_1 & 1);
}

Assistant:

bool BamAlignment::BuildCharData()
{

    // skip if char data already parsed
    if (!SupportData.HasCoreOnly) return true;

    // check system endianness
    bool IsBigEndian = BamTools::SystemIsBigEndian();

    // calculate character lengths/offsets
    const unsigned int dataLength = SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    const unsigned int seqDataOffset =
        SupportData.QueryNameLength + (SupportData.NumCigarOperations * 4);
    const unsigned int qualDataOffset = seqDataOffset + (SupportData.QuerySequenceLength + 1) / 2;
    const unsigned int tagDataOffset = qualDataOffset + SupportData.QuerySequenceLength;
    const unsigned int tagDataLength = dataLength - tagDataOffset;

    // check offsets to see what char data exists
    const bool hasSeqData = (seqDataOffset < qualDataOffset);
    const bool hasQualData = (qualDataOffset < tagDataOffset);
    const bool hasTagData = (tagDataOffset < dataLength);

    // store alignment name (relies on null char in name as terminator)
    Name.assign(SupportData.AllCharData.data());

    // save query sequence
    QueryBases.clear();
    if (hasSeqData) {
        const char* seqData = SupportData.AllCharData.data() + seqDataOffset;
        QueryBases.reserve(SupportData.QuerySequenceLength);
        for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i) {
            const char singleBase =
                Constants::BAM_DNA_LOOKUP[((seqData[(i / 2)] >> (4 * (1 - (i % 2)))) & 0xf)];
            QueryBases.append(1, singleBase);
        }
    }

    // save qualities

    Qualities.clear();
    if (hasQualData) {
        const char* qualData = SupportData.AllCharData.data() + qualDataOffset;

        // if marked as unstored (sequence of 0xFF) - don't do conversion, just fill with 0xFFs
        if (qualData[0] == (char)0xFF)
            Qualities.resize(SupportData.QuerySequenceLength, (char)0xFF);

        // otherwise convert from numeric QV to 'FASTQ-style' ASCII character
        else {
            Qualities.reserve(SupportData.QuerySequenceLength);
            for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i)
                Qualities.append(1, qualData[i] + 33);
        }
    }

    // clear previous AlignedBases
    AlignedBases.clear();

    // if QueryBases has data, build AlignedBases using CIGAR data
    // otherwise, AlignedBases will remain empty (this case IS allowed)
    if (!QueryBases.empty() && QueryBases != "*") {

        // resize AlignedBases
        AlignedBases.reserve(SupportData.QuerySequenceLength);

        // iterate over CigarOps
        int k = 0;
        std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);

            switch (op.Type) {

                // for 'M', 'I', '=', 'X' - write bases
                case (Constants::BAM_CIGAR_MATCH_CHAR):
                case (Constants::BAM_CIGAR_INS_CHAR):
                case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                    AlignedBases.append(QueryBases.substr(k, op.Length));
                    // fall through

                // for 'S' - soft clip, do not write bases
                // but increment placeholder 'k'
                case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                    k += op.Length;
                    break;

                // for 'D' - write gap character
                case (Constants::BAM_CIGAR_DEL_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_DEL);
                    break;

                // for 'P' - write padding character
                case (Constants::BAM_CIGAR_PAD_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_PAD);
                    break;

                // for 'N' - write N's, skip bases in original query sequence
                case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_N);
                    break;

                // for 'H' - hard clip, do nothing to AlignedBases, move to next op
                case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                    break;

                // invalid CIGAR op-code
                default:
                    const std::string message =
                        std::string("invalid CIGAR operation type: ") + op.Type;
                    SetErrorString("BamAlignment::BuildCharData", message);
                    return false;
            }
        }
    }

    // save tag data
    TagData.clear();
    if (hasTagData) {

        char* tagData = (((char*)SupportData.AllCharData.data()) + tagDataOffset);

        if (IsBigEndian) {
            std::size_t i = 0;
            while (i < tagDataLength) {

                i += Constants::BAM_TAG_TAGSIZE;  // skip tag chars (e.g. "RG", "NM", etc.)
                const char type = tagData[i];     // get tag type at position i
                ++i;                              // move i past tag type

                switch (type) {

                    case (Constants::BAM_TAG_TYPE_ASCII):
                    case (Constants::BAM_TAG_TYPE_INT8):
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        // no endian swapping necessary for single-byte data
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_INT16):
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        BamTools::SwapEndian_16p(&tagData[i]);
                        i += sizeof(uint16_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_FLOAT):
                    case (Constants::BAM_TAG_TYPE_INT32):
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        BamTools::SwapEndian_32p(&tagData[i]);
                        i += sizeof(uint32_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_HEX):
                    case (Constants::BAM_TAG_TYPE_STRING):
                        // no endian swapping necessary for hex-string/string data
                        while (tagData[i])
                            ++i;
                        // increment one more for null terminator
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_ARRAY):

                    {
                        // read array type
                        const char arrayType = tagData[i];
                        ++i;

                        // swap endian-ness of number of elements in place, then retrieve for loop
                        BamTools::SwapEndian_32p(&tagData[i]);
                        uint32_t numElements;
                        memcpy(&numElements, &tagData[i], sizeof(uint32_t));
                        i += sizeof(uint32_t);

                        // swap endian-ness of array elements
                        for (std::size_t j = 0; j < numElements; ++j) {
                            switch (arrayType) {
                                case (Constants::BAM_TAG_TYPE_INT8):
                                case (Constants::BAM_TAG_TYPE_UINT8):
                                    // no endian-swapping necessary
                                    ++i;
                                    break;
                                case (Constants::BAM_TAG_TYPE_INT16):
                                case (Constants::BAM_TAG_TYPE_UINT16):
                                    BamTools::SwapEndian_16p(&tagData[i]);
                                    i += sizeof(uint16_t);
                                    break;
                                case (Constants::BAM_TAG_TYPE_FLOAT):
                                case (Constants::BAM_TAG_TYPE_INT32):
                                case (Constants::BAM_TAG_TYPE_UINT32):
                                    BamTools::SwapEndian_32p(&tagData[i]);
                                    i += sizeof(uint32_t);
                                    break;
                                default:
                                    const std::string message =
                                        std::string("invalid binary array type: ") + arrayType;
                                    SetErrorString("BamAlignment::BuildCharData", message);
                                    return false;
                            }
                        }

                        break;
                    }

                    // invalid tag type-code
                    default:
                        const std::string message = std::string("invalid tag type: ") + type;
                        SetErrorString("BamAlignment::BuildCharData", message);
                        return false;
                }
            }
        }

        // store tagData in alignment
        TagData.resize(tagDataLength);
        memcpy((char*)(TagData.data()), tagData, tagDataLength);
    }

    // clear core-only flag & return success
    SupportData.HasCoreOnly = false;
    return true;
}